

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::_InternalSerialize
          (GeneratedCodeInfo_Annotation *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *this_00;
  int *piVar1;
  anon_union_56_1_493b367e_for_GeneratedCodeInfo_Annotation_10 aVar2;
  int iVar3;
  int *piVar4;
  uint8_t *puVar5;
  byte *extraout_RAX;
  byte *pbVar6;
  ulong in_RCX;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  char *in_R9;
  undefined8 *puVar11;
  bool bVar12;
  string_view s;
  string_view field_name;
  
  uVar10 = *(uint *)((long)&this->field_0 + 0x18);
  if ((int)uVar10 < 1) {
LAB_00261c1b:
    aVar2 = this->field_0;
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
      puVar11 = (undefined8 *)
                ((ulong)(this->field_0)._impl_.source_file_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      field_name._M_str = in_R9;
      field_name._M_len = (size_t)"google.protobuf.GeneratedCodeInfo.Annotation.source_file";
      internal::WireFormatLite::VerifyUtf8String
                ((WireFormatLite *)*puVar11,(char *)(ulong)*(uint *)(puVar11 + 1),1,0x38,field_name)
      ;
      s._M_str = (char *)*puVar11;
      s._M_len = puVar11[1];
      target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,2,s,target);
    }
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x2) != (undefined1  [56])0x0) {
      target = internal::WireFormatLite::WriteInt32ToArrayWithField<3>
                         (stream,(this->field_0)._impl_.begin_,target);
    }
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x4) != (undefined1  [56])0x0) {
      target = internal::WireFormatLite::WriteInt32ToArrayWithField<4>
                         (stream,(this->field_0)._impl_.end_,target);
    }
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x8) == (undefined1  [56])0x0)
    goto LAB_00261ccb;
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar8 = (ulong)(this->field_0)._impl_.semantic_;
    pbVar6 = target + 1;
    *target = 0x28;
    in_RCX = uVar8;
    if (0x7f < uVar8) goto LAB_00261d4b;
  }
  else {
    pbVar6 = stream->end_;
    if (pbVar6 <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar6 = stream->end_;
    }
    if (target < pbVar6) {
      this_00 = &(this->field_0)._impl_.path_;
      *target = 10;
      pbVar6 = target + 1;
      uVar9 = uVar10;
      if (0x7f < uVar10) {
        do {
          target = pbVar6;
          *target = (byte)uVar9 | 0x80;
          uVar10 = uVar9 >> 7;
          pbVar6 = target + 1;
          bVar12 = 0x3fff < uVar9;
          uVar9 = uVar10;
        } while (bVar12);
      }
      *pbVar6 = (byte)uVar10;
      if ((undefined1  [16])((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4)
          == (undefined1  [16])0x0) {
        piVar4 = (int *)((long)&this->field_0 + 0x10);
        bVar12 = true;
      }
      else {
        piVar4 = (int *)internal::LongSooRep::elements((LongSooRep *)this_00);
        bVar12 = (undefined1  [16])
                 ((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                 (undefined1  [16])0x0;
      }
      target = target + 2;
      iVar3 = internal::SooRep::size(&this_00->soo_rep_,bVar12);
      piVar1 = piVar4 + iVar3;
      do {
        if (stream->end_ <= target) {
          target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        uVar7 = (ulong)*piVar4;
        uVar8 = uVar7;
        if (0x7f < uVar7) {
          do {
            *target = (byte)uVar8 | 0x80;
            uVar7 = uVar8 >> 7;
            target = target + 1;
            bVar12 = 0x3fff < uVar8;
            uVar8 = uVar7;
          } while (bVar12);
        }
        piVar4 = piVar4 + 1;
        *target = (byte)uVar7;
        target = target + 1;
      } while (piVar4 < piVar1);
      goto LAB_00261c1b;
    }
    _InternalSerialize();
    pbVar6 = extraout_RAX;
LAB_00261d4b:
    do {
      *pbVar6 = (byte)in_RCX | 0x80;
      uVar8 = in_RCX >> 7;
      pbVar6 = pbVar6 + 1;
      bVar12 = 0x3fff < in_RCX;
      in_RCX = uVar8;
    } while (bVar12);
  }
  *pbVar6 = (byte)uVar8;
  target = pbVar6 + 1;
LAB_00261ccb:
  uVar8 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar8 & 1) != 0) {
    puVar5 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar8 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar5;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL GeneratedCodeInfo_Annotation::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const GeneratedCodeInfo_Annotation& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.GeneratedCodeInfo.Annotation)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  {
    int byte_size = this_._impl_._path_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1, this_._internal_path(), byte_size, target);
    }
  }

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string source_file = 2;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_source_file();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.GeneratedCodeInfo.Annotation.source_file");
    target = stream->WriteStringMaybeAliased(2, _s, target);
  }

  // optional int32 begin = 3;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>(
            stream, this_._internal_begin(), target);
  }

  // optional int32 end = 4;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<4>(
            stream, this_._internal_end(), target);
  }

  // optional .google.protobuf.GeneratedCodeInfo.Annotation.Semantic semantic = 5;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        5, this_._internal_semantic(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.GeneratedCodeInfo.Annotation)
  return target;
}